

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmap.cpp
# Opt level: O2

Am_Wrapper * map_fill_proc(Am_Object *self)

{
  uint uVar1;
  Am_Value *this;
  Am_Wrapper *pAVar2;
  Am_Style *this_00;
  
  this = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  uVar1 = Am_Value::operator_cast_to_int(this);
  if (uVar1 < 7) {
    this_00 = (Am_Style *)(&PTR_Am_Red_00105c88)[uVar1];
  }
  else {
    this_00 = (Am_Style *)&Am_White;
  }
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(this_00);
  return pAVar2;
}

Assistant:

Am_Define_Style_Formula(map_fill)
{
  int rank = self.Get(Am_RANK);
  switch (rank) {
  case 0:
    return Am_Red;
  case 1:
    return Am_Blue;
  case 2:
    return Am_Green;
  case 3:
    return Am_Orange;
  case 4:
    return Am_Purple;
  case 5:
    return Am_Cyan;
  case 6:
    return Am_Yellow;
  default:
    return Am_White;
  }
}